

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<unsigned_long_long,char,3>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long_long *t,char *u,unsigned_long_long *result)

{
  byte t_00;
  ulong uVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  t_00 = *u;
  uVar3 = (ulong)t_00;
  if (uVar3 != 0) {
    uVar1 = *t;
    if ((char)t_00 < '\0') {
      uVar2 = AbsValueHelper<char,_0>::Abs(t_00);
      uVar3 = (ulong)uVar2;
    }
    *result = uVar1 % uVar3;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        // u could be negative - if so, need to convert to positive
        if(u < 0)
            result = (T)(t % AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ));
        else
            result = (T)(t % u);
    }